

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_file.c
# Opt level: O2

ssize_t file_write(archive_conflict *a,void *client_data,void *buff,size_t length)

{
  ssize_t sVar1;
  int *piVar2;
  
  do {
    sVar1 = write(*client_data,buff,length);
    if (0 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  archive_set_error((archive *)a,*piVar2,"Write error");
  return -1;
}

Assistant:

static ssize_t
file_write(struct archive *a, void *client_data, const void *buff, size_t length)
{
	struct write_FILE_data	*mine;
	size_t	bytesWritten;

	mine = client_data;
	for (;;) {
		bytesWritten = fwrite(buff, 1, length, mine->f);
		if (bytesWritten <= 0) {
			if (errno == EINTR)
				continue;
			archive_set_error(a, errno, "Write error");
			return (-1);
		}
		return (bytesWritten);
	}
}